

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void Fl_X::activate_window(Window w)

{
  int iVar1;
  
  iVar1 = ewmh_supported();
  if ((iVar1 != 0) && ((fl_xfocus == (Fl_Window *)0x0 || (fl_xfocus->i != (Fl_X *)0x0)))) {
    XSendEvent(fl_display,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),0,
               0x180000);
  }
  return;
}

Assistant:

void Fl_X::activate_window(Window w) {
  if (!ewmh_supported())
    return;

  Window prev = 0;

  if (fl_xfocus) {
    Fl_X *x = Fl_X::i(fl_xfocus);
    if (!x)
      return;
    prev = x->xid;
  }

  send_wm_event(w, fl_NET_ACTIVE_WINDOW, 1 /* application */,
                0 /* timestamp */, prev /* previously active window */);
}